

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall double_conversion::Bignum::AddBignum(Bignum *this,Bignum *other)

{
  uint uVar1;
  Chunk *pCVar2;
  int *piVar3;
  Bignum *in_RSI;
  Bignum *in_RDI;
  Chunk sum_1;
  Chunk my_1;
  Chunk sum;
  Chunk my;
  int i_1;
  int i;
  int bigit_pos;
  Chunk carry;
  Chunk local_58;
  Chunk local_4c;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_28;
  int local_24;
  int local_20;
  uint local_1c;
  int local_18;
  int local_14;
  Bignum *local_10;
  
  local_10 = in_RSI;
  Align((Bignum *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
  local_14 = BigitLength(in_RDI);
  local_18 = BigitLength(local_10);
  std::max<int>(&local_14,&local_18);
  EnsureCapacity(0);
  local_1c = 0;
  local_20 = (int)local_10->exponent_ - (int)in_RDI->exponent_;
  for (local_24 = (int)in_RDI->used_bigits_; local_24 < local_20; local_24 = local_24 + 1) {
    pCVar2 = RawBigit(in_RDI,local_24);
    *pCVar2 = 0;
  }
  for (local_28 = 0; local_28 < local_10->used_bigits_; local_28 = local_28 + 1) {
    if (local_20 < in_RDI->used_bigits_) {
      pCVar2 = RawBigit(in_RDI,local_20);
      local_4c = *pCVar2;
    }
    else {
      local_4c = 0;
    }
    pCVar2 = RawBigit(local_10,local_28);
    uVar1 = local_4c + *pCVar2 + local_1c;
    pCVar2 = RawBigit(in_RDI,local_20);
    *pCVar2 = uVar1 & 0xfffffff;
    local_1c = uVar1 >> 0x1c;
    local_20 = local_20 + 1;
  }
  while (local_1c != 0) {
    if (local_20 < in_RDI->used_bigits_) {
      pCVar2 = RawBigit(in_RDI,local_20);
      local_58 = *pCVar2;
    }
    else {
      local_58 = 0;
    }
    uVar1 = local_58 + local_1c;
    pCVar2 = RawBigit(in_RDI,local_20);
    *pCVar2 = uVar1 & 0xfffffff;
    local_20 = local_20 + 1;
    local_1c = uVar1 >> 0x1c;
  }
  piVar3 = std::max<int>(&local_20,(int *)&stack0xffffffffffffffc4);
  in_RDI->used_bigits_ = (int16_t)*piVar3;
  return;
}

Assistant:

void Bignum::AddBignum(const Bignum& other) {
  DOUBLE_CONVERSION_ASSERT(IsClamped());
  DOUBLE_CONVERSION_ASSERT(other.IsClamped());

  // If this has a greater exponent than other append zero-bigits to this.
  // After this call exponent_ <= other.exponent_.
  Align(other);

  // There are two possibilities:
  //   aaaaaaaaaaa 0000  (where the 0s represent a's exponent)
  //     bbbbb 00000000
  //   ----------------
  //   ccccccccccc 0000
  // or
  //    aaaaaaaaaa 0000
  //  bbbbbbbbb 0000000
  //  -----------------
  //  cccccccccccc 0000
  // In both cases we might need a carry bigit.

  EnsureCapacity(1 + (std::max)(BigitLength(), other.BigitLength()) - exponent_);
  Chunk carry = 0;
  int bigit_pos = other.exponent_ - exponent_;
  DOUBLE_CONVERSION_ASSERT(bigit_pos >= 0);
  for (int i = used_bigits_; i < bigit_pos; ++i) {
    RawBigit(i) = 0;
  }
  for (int i = 0; i < other.used_bigits_; ++i) {
    const Chunk my = (bigit_pos < used_bigits_) ? RawBigit(bigit_pos) : 0;
    const Chunk sum = my + other.RawBigit(i) + carry;
    RawBigit(bigit_pos) = sum & kBigitMask;
    carry = sum >> kBigitSize;
    ++bigit_pos;
  }
  while (carry != 0) {
    const Chunk my = (bigit_pos < used_bigits_) ? RawBigit(bigit_pos) : 0;
    const Chunk sum = my + carry;
    RawBigit(bigit_pos) = sum & kBigitMask;
    carry = sum >> kBigitSize;
    ++bigit_pos;
  }
  used_bigits_ = (std::max)(bigit_pos, static_cast<int>(used_bigits_));
  DOUBLE_CONVERSION_ASSERT(IsClamped());
}